

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O1

void curses_print_message_core(wchar_t turn,char *msg,nh_bool canblock)

{
  char *pcVar1;
  message *pmVar2;
  char **ppcVar3;
  wchar_t wVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  wchar_t wVar8;
  undefined7 in_register_00000011;
  long lVar9;
  wchar_t wVar10;
  long lVar11;
  wchar_t wVar12;
  char (*pacVar13) [81];
  bool bVar14;
  char **output;
  wchar_t output_count;
  char **local_48;
  wchar_t local_40;
  undefined4 local_3c;
  char *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,canblock);
  local_38 = msg;
  if (msghistory == (message *)0x0) {
    alloc_hist_array();
  }
  wVar8 = histsize;
  pmVar2 = msghistory;
  if ((turn < prevturn) && (msghistory != (message *)0x0)) {
    lVar9 = (long)histpos;
    wVar12 = histpos;
    if (L'\0' < histsize && turn <= msghistory[lVar9].turn) {
      wVar10 = L'\x01';
      do {
        pmVar2[lVar9].turn = 0;
        if (pmVar2[lVar9].msg != (char *)0x0) {
          free(pmVar2[lVar9].msg);
          pmVar2[lVar9].msg = (char *)0x0;
        }
        wVar4 = wVar8;
        if (L'\0' < wVar12) {
          wVar4 = L'\0';
        }
        wVar12 = wVar12 + wVar4 + L'\xffffffff';
        lVar9 = (long)wVar12;
      } while ((turn <= pmVar2[lVar9].turn) &&
              (bVar14 = wVar10 < wVar8, wVar10 = wVar10 + L'\x01', bVar14));
    }
    histpos = wVar12;
    curline = L'\0';
    lVar9 = 0;
    do {
      msglines[0][lVar9] = '\0';
      lVar9 = lVar9 + 0x51;
    } while (lVar9 != 0xca8);
    if (L'\0' < wVar8) {
      wVar12 = L'\0';
      do {
        wVar12 = wVar12 + L'\x01';
        if (histpos + wVar12 < wVar8) {
          wVar8 = L'\0';
        }
        iVar7 = (histpos + wVar12) - wVar8;
        pcVar1 = msghistory[iVar7].msg;
        if (pcVar1 != (char *)0x0) {
          if (prevturn < msghistory[iVar7].turn) {
            last_redraw_curline = curline;
            start_of_turn_curline = curline;
          }
          prevturn = msghistory[iVar7].turn;
          lVar9 = (long)curline;
          pacVar13 = msglines + lVar9;
          sVar5 = strlen(*pacVar13);
          sVar6 = strlen(pcVar1);
          if (sVar6 + sVar5 + 2 < 0x50) {
            if ((*pacVar13)[0] != '\0') {
              sVar5 = strlen(*pacVar13);
              (*pacVar13 + sVar5)[0] = ' ';
              (*pacVar13 + sVar5)[1] = ' ';
              *(undefined1 *)(lVar9 * 0x51 + 0x1309b2 + sVar5) = 0;
            }
            strcat(*pacVar13,pcVar1);
          }
          else {
            ui_wrap_text(L'P',pcVar1,&local_40,&local_48);
            ppcVar3 = local_48;
            lVar9 = (long)local_40;
            if (0 < lVar9) {
              lVar11 = 0;
              wVar8 = curline;
              do {
                if (msglines[wVar8][0] != '\0') {
                  bVar14 = L'&' < wVar8;
                  wVar8 = wVar8 + L'\x01';
                  if (bVar14) {
                    wVar8 = L'\0';
                  }
                  curline = wVar8;
                  msglines[wVar8][0] = '\0';
                }
                strcpy(msglines[wVar8],ppcVar3[lVar11]);
                lVar11 = lVar11 + 1;
              } while (lVar9 != lVar11);
            }
            ui_free_wrap(local_48);
          }
        }
        wVar8 = histsize;
      } while (wVar12 < histsize);
    }
  }
  pcVar1 = local_38;
  wVar8 = action;
  if (*local_38 == '\0') {
    return;
  }
  if ((prevaction < action) && (skip_more = 0, msglines[curline][0] != '\0')) {
    wVar12 = curline + L'\x01';
    bVar14 = curline < L'\'';
    curline = L'\0';
    if (bVar14) {
      curline = wVar12;
    }
    msglines[curline][0] = '\0';
  }
  prevaction = wVar8;
  prevturn = turn;
  store_message(turn,local_38);
  if (msgwin == (WINDOW *)0x0) {
    bVar14 = false;
    wVar8 = L'\xffffffff';
  }
  else {
    bVar14 = msgwin->_maxy == 0;
    wVar8 = msgwin->_maxx + L'\x01';
  }
  wVar12 = L'O';
  if (wVar8 < L'O') {
    wVar12 = wVar8;
  }
  wVar8 = wVar12 + L'\xfffffff8';
  if (!bVar14) {
    wVar8 = wVar12;
  }
  if (settings.msg_per_line == '\0') {
    sVar5 = strlen(msglines[curline]);
    sVar6 = strlen(pcVar1);
    bVar14 = sVar6 + sVar5 + 2 < (ulong)(long)wVar8;
  }
  else {
    bVar14 = msglines[curline][0] == '\0';
  }
  iVar7 = strncmp(pcVar1,"You die",7);
  if ((bVar14) && (iVar7 != 0)) {
    lVar9 = (long)curline;
    pacVar13 = msglines + lVar9;
    if (msglines[lVar9][0] != '\0') {
      sVar5 = strlen(*pacVar13);
      (*pacVar13 + sVar5)[0] = ' ';
      (*pacVar13 + sVar5)[1] = ' ';
      *(undefined1 *)(lVar9 * 0x51 + 0x1309b2 + sVar5) = 0;
    }
    strcat(*pacVar13,pcVar1);
  }
  else {
    ui_wrap_text(wVar8,pcVar1,&local_40,&local_48);
    ppcVar3 = local_48;
    if (0 < (long)local_40) {
      lVar9 = 0;
      do {
        if (msglines[curline][0] != '\0') {
          if ((char)local_3c != '\0') {
            if (msgwin == (WINDOW *)0x0) {
              iVar7 = -3;
            }
            else {
              iVar7 = msgwin->_maxy + -1;
            }
            if (iVar7 < ((curline - last_redraw_curline) + 0x28) % 0x28) {
              more();
              goto LAB_0010ebb1;
            }
          }
          wVar8 = curline + L'\x01';
          if (L'&' < curline) {
            wVar8 = L'\0';
          }
          curline = wVar8;
          msglines[wVar8][0] = '\0';
        }
LAB_0010ebb1:
        strcpy(msglines[curline],ppcVar3[lVar9]);
        lVar9 = lVar9 + 1;
      } while (local_40 != lVar9);
    }
    ui_free_wrap(local_48);
  }
  draw_msgwin();
  return;
}

Assistant:

static void curses_print_message_core(int turn, const char *msg, nh_bool canblock)
{
    int hsize, vsize, maxlen;
    nh_bool use_current_line, died;

    if (!msghistory)
	alloc_hist_array();

    if (turn < prevturn) /* going back in time can happen during replay */
	prune_messages(turn);

    if (!*msg)
	return; /* empty message. done. */

    if (action > prevaction) {
	/* re-enable output if it was stopped and start a new line */
	skip_more = FALSE;
	newline();
    }
    prevturn = turn;
    prevaction = action;

    store_message(turn, msg);

    /*
     * generally we want to put as many messages on one line as possible to
     * maximize space usage. A new line is begun after each player turn or if
     * more() is called via pause_messages(). "You die" also deserves its own line.
     *
     * If the message area is only one line high, space for "--More--" must be
     * reserved at the end of the line, otherwise  --More-- is shown on a new line.
     */
    getmaxyx(msgwin, vsize, hsize);
    maxlen = hsize;
    if (maxlen >= COLNO) maxlen = COLNO - 1;
    if (vsize == 1) maxlen -= 8; /* for "--More--" */

    if (settings.msg_per_line) {
	use_current_line = !msglines[curline][0];
    } else {
	use_current_line = (strlen(msglines[curline]) + strlen(msg) + 2 < maxlen);
    }
    died = !strncmp(msg, "You die", 7);
    if (use_current_line && !died) {
	if (msglines[curline][0])
	    strcat(msglines[curline], "  ");
	strcat(msglines[curline], msg);
    } else {
	int i, output_count;
	char **output;

	ui_wrap_text(maxlen, msg, &output_count, &output);

	for (i = 0; i < output_count; i++) {
	    if (msglines[curline][0]) {
		/*
		 * If we would scroll a message off the screen that
		 * the user hasn't had a chance to look at this redraw,
		 * then run more(), else newline().  Because the
		 * --More-- takes up a line by itself, we need to
		 * offset that by one line.  Thus, a message window of
		 * height 2 requires us to always show a --More-- even
		 * if we're on the first message of the redraw; with
		 * height 3, we can safely newline after the first
		 * line of messages but must --More-- after the
		 * second, etc.  getmaxy() gives the height of the window
		 * minus 1, which is why we only subtract 2 not 3.
		 */
		if (canblock &&
		    (curline + MAX_MSGLINES - last_redraw_curline) %
		    MAX_MSGLINES > getmaxy(msgwin) - 2)
		    more();
		else
		    newline();
	    }
	    strcpy(msglines[curline], output[i]);
	}

	ui_free_wrap(output);
    }

    draw_msgwin();
}